

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O1

BrailleCanvas * __thiscall
plot::BrailleCanvas::line(BrailleCanvas *this,Color *color,Point from,Point to,TerminalOp op)

{
  long lVar1;
  Rect rct;
  ulong uVar2;
  BrailleCanvas *pBVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  anon_class_32_4_3ac4ecb1 local_50;
  
  lVar7 = to.x;
  lVar4 = from.y;
  lVar5 = from.x;
  lVar8 = lVar5 - lVar7;
  lVar6 = lVar7;
  if (lVar5 < lVar7) {
    lVar6 = lVar5;
  }
  lVar1 = to.y;
  if (lVar8 == 0 || lVar5 < lVar7) {
    lVar8 = -(lVar5 - lVar7);
    lVar5 = lVar7;
    lVar1 = lVar4;
    lVar4 = to.y;
  }
  uVar2 = lVar4 - lVar1;
  lVar7 = (((long)uVar2 >> 0x3f) + uVar2) - ((long)~uVar2 >> 0x3f);
  local_50.dy = utils::gcd<long>(lVar8 + 1,lVar7);
  local_50.dx = (lVar8 + 1) / local_50.dy;
  local_50.dy = lVar7 / local_50.dy;
  rct.p1.y = lVar1;
  rct.p1.x = lVar6;
  rct.p2.x = lVar5;
  rct.p2.y = lVar4;
  local_50.x0 = lVar6;
  local_50.y0 = lVar1;
  pBVar3 = stroke<plot::BrailleCanvas::line(plot::Color_const&,plot::GenericPoint<long>,plot::GenericPoint<long>,plot::TerminalOp)::_lambda(long)_1_>
                     (this,color,rct,&local_50,op);
  return pBVar3;
}

Assistant:

BrailleCanvas& line(Color const& color, Point from, Point to, TerminalOp op = TerminalOp::Over) {
        auto sorted = Rect(from, to).sorted_x();
        auto dx = (sorted.p2.x - sorted.p1.x) + 1,
             dy = sorted.p2.y - sorted.p1.y;

        dy += (dy >= 0) - (dy < 0);

        auto gcd = utils::gcd(dx, dy);
        dx /= gcd; dy /= gcd;

        return stroke(color, sorted, [dx, dy, x0 = sorted.p1.x, y0 = sorted.p1.y](Coord x) {
            auto base = (x - x0)*dy/dx + y0,
                 end_ = (1 + x - x0)*dy/dx + y0;
            return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
        }, op);
    }